

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_idate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  tm *ptVar7;
  int iVar8;
  jx9_value *pjVar9;
  jx9_real jVar10;
  time_t t;
  int nLen;
  anon_union_8_3_18420de5_for_x local_38;
  int local_2c;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar9 = pCtx->pRet;
    jx9MemObjRelease(pjVar9);
    (pjVar9->x).iVal = -1;
    goto LAB_00134093;
  }
  pbVar6 = (byte *)jx9_value_to_string(*apArg,&local_2c);
  if (local_2c < 1) {
    pjVar9 = pCtx->pRet;
    jx9MemObjRelease(pjVar9);
    (pjVar9->x).iVal = -1;
    pjVar9->iFlags = pjVar9->iFlags & 0xfffffe90U | 2;
  }
  if (nArg == 1) {
    time(&local_38.iVal);
  }
  else {
    pjVar9 = apArg[1];
    if ((pjVar9->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar9);
      local_38 = pjVar9->x;
      ptVar7 = localtime(&local_38.iVal);
      if (ptVar7 != (tm *)0x0) goto LAB_00133e4f;
    }
    time(&local_38.iVal);
  }
LAB_00133e4f:
  ptVar7 = localtime(&local_38.iVal);
  iVar8 = ptVar7->tm_hour;
  iVar2 = ptVar7->tm_mon;
  uVar3 = ptVar7->tm_year;
  iVar5 = uVar3 + 0x76c;
  bVar1 = *pbVar6;
  if (bVar1 < 100) {
    if (bVar1 < 0x55) {
      if (bVar1 == 0x48) {
        jVar10 = (jx9_real)(long)iVar8;
      }
      else if (bVar1 == 0x49) {
        jVar10 = (jx9_real)(long)ptVar7->tm_isdst;
      }
      else {
        if (bVar1 != 0x4c) goto switchD_00133ea4_caseD_56;
        uVar4 = iVar5 * -0x3d70a3d7 + 0x51eb850;
        if ((uVar4 >> 4 | iVar5 * -0x70000000) < 0xa3d70b) {
          jVar10 = 4.94065645841247e-324;
        }
        else {
          if ((uVar4 >> 2 | uVar3 * 0x40000000) < 0x28f5c29) goto switchD_00133ea4_caseD_5a;
          jVar10 = (jx9_real)(ulong)((uVar3 & 3) == 0);
        }
      }
    }
    else {
      switch(bVar1) {
      case 0x55:
        jVar10 = (jx9_real)time((time_t *)0x0);
        break;
      default:
        goto switchD_00133ea4_caseD_56;
      case 0x57:
        jVar10 = (jx9_real)(long)aISO8601[ptVar7->tm_wday % 7];
        break;
      case 0x59:
        goto switchD_00133ea4_caseD_59;
      case 0x5a:
        goto switchD_00133ea4_caseD_5a;
      }
    }
    goto LAB_00134084;
  }
  switch(bVar1) {
  case 0x68:
    iVar5 = (((uint)(iVar8 / 6 + (iVar8 >> 0x1f)) >> 1) - (iVar8 >> 0x1f)) * -0xc + iVar8 + 1;
    goto switchD_00133ea4_caseD_59;
  case 0x69:
    jVar10 = (jx9_real)(long)ptVar7->tm_min;
    break;
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x78:
switchD_00133ea4_caseD_56:
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Unknown date format token");
switchD_00133ea4_caseD_5a:
    jVar10 = 0.0;
    break;
  case 0x6d:
    jVar10 = (jx9_real)(long)iVar2;
    break;
  case 0x73:
    jVar10 = (jx9_real)(long)ptVar7->tm_sec;
    break;
  case 0x74:
    iVar8 = DateFormat::aMonDays
            [(int)(iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc)];
    if ((iVar2 == 1) && (iVar5 != (iVar5 / 400) * 400)) {
      if ((uVar3 & 3) != 0) {
        iVar8 = 0x1c;
      }
      if ((iVar5 * -0x3d70a3d7 + 0x51eb850U >> 2 | uVar3 * 0x40000000) < 0x28f5c29) {
        iVar8 = 0x1c;
      }
    }
    jVar10 = (jx9_real)(long)iVar8;
    break;
  case 0x77:
    jVar10 = (jx9_real)(long)ptVar7->tm_wday;
    break;
  case 0x79:
    iVar5 = iVar5 % 100;
switchD_00133ea4_caseD_59:
    jVar10 = (jx9_real)(long)iVar5;
    break;
  case 0x7a:
    jVar10 = (jx9_real)(long)ptVar7->tm_yday;
    break;
  default:
    if (bVar1 != 100) goto switchD_00133ea4_caseD_56;
    jVar10 = (jx9_real)(long)ptVar7->tm_mday;
  }
LAB_00134084:
  pjVar9 = pCtx->pRet;
  jx9MemObjRelease(pjVar9);
  (pjVar9->x).rVal = jVar10;
LAB_00134093:
  pjVar9->iFlags = pjVar9->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_idate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_int64 iVal = 0;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return -1*/
		jx9_result_int(pCtx, -1);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Perform the requested operation */
	switch(zFormat[0]){
	case 'd':
		/* Day of the month */
		iVal = sTm.tm_mday;
		break;
	case 'h':
		/*	Hour (12 hour format)*/
		iVal = 1 + (sTm.tm_hour % 12);
		break;
	case 'H':
		/* Hour (24 hour format)*/
		iVal = sTm.tm_hour;
		break;
	case 'i':
		/*Minutes*/
		iVal = sTm.tm_min;
		break;
	case 'I':
		/*	returns 1 if DST is activated, 0 otherwise */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
		iVal = sTm.tm_isdst;
		break;
	case 'L':
		/* 	returns 1 for leap year, 0 otherwise */
		iVal = IS_LEAP_YEAR(sTm.tm_year);
		break;
	case 'm':
		/* Month number*/
		iVal = sTm.tm_mon;
		break;
	case 's':
		/*Seconds*/
		iVal = sTm.tm_sec;
		break;
	case 't':{
		/*Days in current month*/
		static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
		int nDays = aMonDays[sTm.tm_mon % 12 ];
		if( sTm.tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(sTm.tm_year) ){
			nDays = 28;
		}
		iVal = nDays;
		break;
			 }
	case 'U':
		/*Seconds since the Unix Epoch*/
		iVal = (jx9_int64)time(0);
		break;
	case 'w':
		/*	Day of the week (0 on Sunday) */
		iVal = sTm.tm_wday;
		break;
	case 'W': {
		/* ISO-8601 week number of year, weeks starting on Monday */
		static const int aISO8601[] = { 7 /* Sunday */, 1 /* Monday */, 2, 3, 4, 5, 6 };
		iVal = aISO8601[sTm.tm_wday % 7 ];
		break;
			  }
	case 'y':
		/* Year (2 digits) */
		iVal = sTm.tm_year % 100;
		break;
	case 'Y':
		/* Year (4 digits) */
		iVal = sTm.tm_year;
		break;
	case 'z':
		/* Day of the year */
		iVal = sTm.tm_yday;
		break;
	case 'Z':
		/*Timezone offset in seconds*/
		iVal = sTm.tm_gmtoff;
		break;
	default:
		/* unknown format, throw a warning */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Unknown date format token");
		break;
	}
	/* Return the time value */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}